

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O3

Status __thiscall
soplex::SLUFactorRational::load(SLUFactorRational *this,SVectorRational **matrix,int dm)

{
  U *pUVar1;
  Col *pCVar2;
  Status SVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  Rational better;
  Rational last;
  Rational lastStability;
  data_type local_1d8;
  uint local_1c8;
  undefined1 local_1c4;
  char local_1c3;
  char local_1c2;
  data_type local_1b8;
  uint local_1a8;
  undefined1 local_1a4;
  char local_1a3;
  char local_1a2;
  data_type local_198;
  char local_183;
  char local_182;
  data_type local_178;
  char local_163;
  char local_162;
  data_type local_158;
  uint local_148;
  undefined1 local_144;
  char local_143;
  char local_142;
  data_type local_138;
  uint local_128;
  undefined1 local_124;
  char local_123;
  char local_122;
  SVectorRational **local_110;
  longdouble local_104;
  data_type local_f8;
  char local_e3;
  char local_e2;
  uint local_d8;
  void *local_d0;
  char local_c3;
  char local_c2;
  data_type local_b8;
  char local_a3;
  char local_a2;
  uint local_98;
  void *local_90;
  char local_83;
  char local_82;
  data_type local_78;
  char local_63;
  char local_62;
  uint local_58;
  void *local_50;
  char local_43;
  char local_42;
  
  (*(this->super_SLinSolverRational)._vptr_SLinSolverRational[6])(&local_78,this);
  pUVar1 = &(this->super_CLUFactorRational).u;
  (this->super_CLUFactorRational).u.row.list.next = (Dring *)pUVar1;
  (this->super_CLUFactorRational).u.row.list.prev = (Dring *)pUVar1;
  pCVar2 = &(this->super_CLUFactorRational).u.col;
  (this->super_CLUFactorRational).u.col.list.next = &pCVar2->list;
  (this->super_CLUFactorRational).u.col.list.prev = &pCVar2->list;
  this->usetup = false;
  (this->super_CLUFactorRational).l.updateType = this->uptype;
  (this->super_CLUFactorRational).l.firstUpdate = 0;
  (this->super_CLUFactorRational).l.firstUnused = 0;
  local_110 = matrix;
  if ((this->super_CLUFactorRational).thedim == dm) {
    local_104 = (longdouble)0.08;
    local_198.ld.capacity = SUB104(local_104,0);
    local_198.la[0]._4_4_ = (undefined4)((unkuint10)local_104 >> 0x20);
    local_198.la[1]._0_2_ = (undefined2)((unkuint10)local_104 >> 0x40);
    bVar6 = boost::multiprecision::default_ops::
            eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_78.ld,(longdouble *)&local_198,(true_ *)&local_1d8.ld);
    if (bVar6) {
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_198.ld,&(this->minThreshold).m_backend);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_b8.ld,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_198.ld);
      betterThreshold((Rational *)&local_1d8.ld,(Rational *)&local_b8.ld);
      if ((local_83 == '\0') && (local_82 == '\0')) {
        operator_delete(local_90,(ulong)local_98 << 3);
      }
      if ((local_a3 == '\0') && (local_a2 == '\0')) {
        operator_delete(local_b8.ld.data,(ulong)local_b8.ld.capacity << 3);
      }
      while( true ) {
        iVar7 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_1d8.ld,&(this->lastThreshold).m_backend);
        if (-1 < iVar7) break;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_198.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_1d8.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_178.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_1b8.ld);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_f8.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_198.ld);
        betterThreshold((Rational *)&local_158.ld,(Rational *)&local_f8.ld);
        if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
          operator_delete(local_1d8.ld.data,(local_1d8.la[0] & 0xffffffff) << 3);
        }
        local_1c8 = local_148;
        local_1c4 = local_144;
        local_1c3 = local_143;
        local_1c2 = local_142;
        if (local_143 == '\x01') {
          memcpy(&local_1d8,&local_158,(ulong)local_148 << 3);
        }
        else {
          local_1d8.la[0] = (limb_type)local_158.ld.capacity;
          local_1d8.ld.data = local_158.ld.data;
          local_148 = 0;
          local_143 = '\x01';
        }
        if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
          operator_delete(local_1b8.ld.data,(local_1b8.la[0] & 0xffffffff) << 3);
        }
        cVar5 = local_122;
        cVar4 = local_123;
        local_1a8 = local_128;
        local_1a4 = local_124;
        local_1a3 = local_123;
        local_1a2 = local_122;
        if (local_123 == '\0') {
          local_1b8.la[0] = (limb_type)local_138.ld.capacity;
          local_1b8.ld.data = local_138.ld.data;
          local_128 = 0;
          local_123 = '\x01';
        }
        else {
          memcpy(&local_1b8,&local_138,(ulong)local_128 << 3);
          if ((cVar4 == '\0') && (cVar5 == '\0')) {
            operator_delete(local_138.ld.data,(ulong)local_138.ld.capacity << 3);
          }
        }
        if ((local_143 == '\0') && (local_142 == '\0')) {
          operator_delete(local_158.ld.data,(ulong)local_158.ld.capacity << 3);
        }
        if ((local_c3 == '\0') && (local_c2 == '\0')) {
          operator_delete(local_d0,(ulong)local_d8 << 3);
        }
        if ((local_e3 == '\0') && (local_e2 == '\0')) {
          operator_delete(local_f8.ld.data,(ulong)local_f8.ld.capacity << 3);
        }
      }
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&this->lastThreshold,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_198.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&(this->lastThreshold).m_backend.m_value.den,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_178.ld);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->minStability,local_104);
      if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
        operator_delete(local_1b8.ld.data,(local_1b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
        operator_delete(local_1d8.ld.data,(local_1d8.la[0] & 0xffffffff) << 3);
      }
      if ((local_163 == '\0') && (local_162 == '\0')) {
        operator_delete(local_178.ld.data,(ulong)local_178.ld.capacity << 3);
      }
      if ((local_183 == '\0') && (local_182 == '\0')) {
        operator_delete((void *)CONCAT62(local_198.la[1]._2_6_,local_198.la[1]._0_2_),
                        (ulong)local_198.ld.capacity << 3);
      }
    }
  }
  else {
    (*(this->super_SLinSolverRational)._vptr_SLinSolverRational[2])(this);
    (this->super_CLUFactorRational).thedim = dm;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->vec,dm,true);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->ssvec,(this->super_CLUFactorRational).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->eta,(this->super_CLUFactorRational).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&this->forest,(this->super_CLUFactorRational).thedim);
    (this->super_CLUFactorRational).work =
         (this->vec).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    spx_realloc<int*>(&(this->super_CLUFactorRational).row.perm,
                      (this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).row.orig,
                      (this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).col.perm,
                      (this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).col.orig,
                      (this->super_CLUFactorRational).thedim);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(&(this->super_CLUFactorRational).diag,(this->super_CLUFactorRational).thedim,true);
    spx_realloc<soplex::CLUFactorRational::Dring*>
              (&(this->super_CLUFactorRational).u.row.elem,(this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.row.len,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.row.max,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.row.start,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<soplex::CLUFactorRational::Dring*>
              (&(this->super_CLUFactorRational).u.col.elem,(this->super_CLUFactorRational).thedim);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.col.len,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.col.max,
                      (this->super_CLUFactorRational).thedim + 1);
    spx_realloc<int*>(&(this->super_CLUFactorRational).u.col.start,
                      (this->super_CLUFactorRational).thedim + 1);
    iVar7 = (this->super_CLUFactorRational).thedim + 1000;
    (this->super_CLUFactorRational).l.startSize = iVar7;
    spx_realloc<int*>(&(this->super_CLUFactorRational).l.row,iVar7);
    spx_realloc<int*>(&(this->super_CLUFactorRational).l.start,
                      (this->super_CLUFactorRational).l.startSize);
  }
  iVar7 = (this->super_CLUFactorRational).thedim;
  (this->super_CLUFactorRational).u.row.list.idx = iVar7;
  (this->super_CLUFactorRational).u.row.start[iVar7] = 0;
  (this->super_CLUFactorRational).u.row.max[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).u.row.len[(this->super_CLUFactorRational).thedim] = 0;
  iVar7 = (this->super_CLUFactorRational).thedim;
  (this->super_CLUFactorRational).u.col.list.idx = iVar7;
  (this->super_CLUFactorRational).u.col.start[iVar7] = 0;
  (this->super_CLUFactorRational).u.col.max[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).u.col.len[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).stat = OK;
  CLUFactorRational::factor(&this->super_CLUFactorRational,local_110,&this->lastThreshold);
  (*(this->super_SLinSolverRational)._vptr_SLinSolverRational[6])(&local_198,this);
  if ((local_163 == '\0') && (local_162 == '\0')) {
    operator_delete(local_178.ld.data,(ulong)local_178.ld.capacity << 3);
  }
  if ((local_183 == '\0') && (local_182 == '\0')) {
    operator_delete((void *)CONCAT62(local_198.la[1]._2_6_,local_198.la[1]._0_2_),
                    (ulong)local_198.ld.capacity << 3);
  }
  SVar3 = (this->super_CLUFactorRational).stat;
  if ((local_43 == '\0') && (local_42 == '\0')) {
    operator_delete(local_50,(ulong)local_58 << 3);
  }
  if ((local_63 == '\0') && (local_62 == '\0')) {
    operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
  }
  return SVar3;
}

Assistant:

inline SLUFactorRational::Status SLUFactorRational::load(const SVectorRational* matrix[], int dm)
{
   assert(dm     >= 0);
   assert(matrix != nullptr);

   Rational lastStability = stability();

   initDR(u.row.list);
   initDR(u.col.list);

   usetup        = false;
   l.updateType  = uptype;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   if(dm != thedim)
   {
      clear();

      thedim = dm;
      vec.reDim(thedim);
      ssvec.reDim(thedim);
      eta.reDim(thedim);
      forest.reDim(thedim);
      work = vec.get_ptr();

      spx_realloc(row.perm, thedim);
      spx_realloc(row.orig, thedim);
      spx_realloc(col.perm, thedim);
      spx_realloc(col.orig, thedim);
      diag.reDim(thedim);

      spx_realloc(u.row.elem,  thedim);
      spx_realloc(u.row.len,   thedim + 1);
      spx_realloc(u.row.max,   thedim + 1);
      spx_realloc(u.row.start, thedim + 1);

      spx_realloc(u.col.elem,  thedim);
      spx_realloc(u.col.len,   thedim + 1);
      spx_realloc(u.col.max,   thedim + 1);
      spx_realloc(u.col.start, thedim + 1);

      l.startSize = thedim + SOPLEX_MAXUPDATES;

      spx_realloc(l.row,   l.startSize);
      spx_realloc(l.start, l.startSize);
   }
   // the last factorization was reasonably stable, so we decrease the Markowitz threshold (stored in lastThreshold) in
   // order favour sparsity
   else if(lastStability > 2.0 * SOPLEX_MINSTABILITYRAT)
   {
      // we reset lastThreshold to its previous value in the sequence minThreshold, betterThreshold(minThreshold),
      // betterThreshold(betterThreshold(minThreshold)), ...
      Rational last   = minThreshold;
      Rational better = betterThreshold(last);

      while(better < lastThreshold)
      {
         last   = better;
         better = betterThreshold(last);
      }

      lastThreshold = last;

      // we reset the minimum stability (which might have been decreased below) to ensure that the increased sparsity
      // does not hurt the stability
      minStability  = 2 * SOPLEX_MINSTABILITYRAT;
   }

   u.row.list.idx      = thedim;
   u.row.start[thedim] = 0;
   u.row.max[thedim]   = 0;
   u.row.len[thedim]   = 0;

   u.col.list.idx      = thedim;
   u.col.start[thedim] = 0;
   u.col.max[thedim]   = 0;
   u.col.len[thedim]   = 0;

   stat = OK;
   factor(matrix, lastThreshold);


   SPxOut::debug(this, "DSLUFA02 threshold = {}\tstability = {}\tSOPLEX_MINSTABILITYRAT = {}\n",
                 lastThreshold, stability(), SOPLEX_MINSTABILITYRAT);
   SPX_DEBUG(
      int i;
      FILE* fl = fopen("dump.lp", "w");
      std::cout << "DSLUFA03 Basis:\n";
      int j = 0;

      for(i = 0; i < dim(); ++i)
      j += matrix[i]->size();
      for(i = 0; i < dim(); ++i)
   {
      for(j = 0; j < matrix[i]->size(); ++j)
            fprintf(fl, "%8d  %8d  %s\n",
                    i + 1, matrix[i]->index(j) + 1, matrix[i]->value(j).str());
      }
   fclose(fl);
   std::cout << "DSLUFA04 LU-Factors:" << std::endl;
             dump();

             std::cout << "DSLUFA05 threshold = " << lastThreshold
             << "\tstability = " << stability() << std::endl;
   )

   assert(isConsistent());
   return Status(stat);
}